

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

BrandInitializerText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandInitializers
          (BrandInitializerText *__return_storage_ptr__,CapnpcCppMain *this,
          TemplateContext *templateContext,Schema schema)

{
  _Rb_tree_color _Var1;
  StringTree *pSVar2;
  StringTree *pSVar3;
  SegmentReader *pSVar4;
  CapTableReader *pCVar5;
  RemoveConst<kj::StringTree> *pRVar6;
  _Base_ptr p_Var7;
  BrandInitializerText *extraout_RAX;
  Schema schema_00;
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  *depMap_00;
  _Rb_tree_color index;
  size_t newSize;
  char *params_2;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  char (*params_7) [11];
  Vector<kj::StringTree> bindings;
  ArrayBuilder<kj::StringTree> scopes;
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  depMap;
  RawBrandedSchema *local_e0;
  PointerReader local_d8;
  ArrayPtr<const_char> local_b8;
  CapnpcCppMain *local_a8;
  TemplateContext *local_a0;
  Reader param;
  map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  scopeMap;
  
  TemplateContext::getScopeMap(&scopeMap,templateContext);
  pRVar6 = (RemoveConst<kj::StringTree> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x38,0,scopeMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  params_2 = (char *)0x0;
  local_a8 = this;
  local_a0 = (TemplateContext *)schema.raw;
  bindings.builder.ptr =
       (StringTree *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x38,0,scopeMap._M_t._M_impl.super__Rb_tree_header._M_node_count * 2,
                  (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  schema_00.raw =
       (RawBrandedSchema *)
       (bindings.builder.ptr + scopeMap._M_t._M_impl.super__Rb_tree_header._M_node_count * 2);
  bindings.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  bindings.builder.pos = bindings.builder.ptr;
  bindings.builder.endPtr = (StringTree *)schema_00.raw;
  scopes.pos = pRVar6;
  if ((_Rb_tree_header *)scopeMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &scopeMap._M_t._M_impl.super__Rb_tree_header) {
    p_Var7 = scopeMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      params_7 = (char (*) [11])0x16c829;
      kj::hex((CappedArray<char,_17UL> *)&param._reader,*(unsigned_long *)(p_Var7 + 1));
      local_d8.segment =
           (SegmentReader *)
           (((long)bindings.builder.pos - (long)bindings.builder.ptr >> 3) * 0x6db6db6db6db6db7);
      local_b8.ptr._0_4_ = p_Var7[2]._M_color;
      params_2 = ", brandBindings + ";
      kj::
      strTree<char_const(&)[5],char_const(&)[3],kj::CappedArray<char,17ul>,char_const(&)[19],unsigned_long,char_const(&)[3],unsigned_int,char_const(&)[11]>
                ((StringTree *)&depMap,(kj *)"  { ",(char (*) [5])0x220d62,
                 (char (*) [3])&param._reader,(CappedArray<char,_17UL> *)", brandBindings + ",
                 (char (*) [19])&local_d8,(unsigned_long *)0x22212e,(char (*) [3])&local_b8,
                 (uint *)", false},\n",params_7);
      (scopes.pos)->size_ = depMap._M_t._M_impl._0_8_;
      ((scopes.pos)->text).content.ptr =
           (char *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      ((scopes.pos)->text).content.size_ =
           (size_t)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      ((scopes.pos)->text).content.disposer =
           (ArrayDisposer *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ((scopes.pos)->branches).ptr =
           (Branch *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      ((scopes.pos)->branches).size_ = depMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
      ((scopes.pos)->branches).disposer = (ArrayDisposer *)local_e0;
      scopes.pos = scopes.pos + 1;
      _Var1 = p_Var7[2]._M_color;
      if (_Var1 != _S_red) {
        index = _S_red;
        do {
          depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          depMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          _::ListReader::getStructElement(&param._reader,(ListReader *)&p_Var7[1]._M_parent,index);
          local_d8.nestingLimit = param._reader.nestingLimit;
          local_d8.pointer = param._reader.pointers;
          if (param._reader.pointerCount == 0) {
            local_d8.pointer = (WirePointer *)0x0;
            local_d8.nestingLimit = 0x7fffffff;
          }
          uVar8 = 0;
          uVar9 = 0;
          uVar10 = 0;
          uVar11 = 0;
          if (param._reader.pointerCount != 0) {
            uVar8 = param._reader.segment._0_4_;
            uVar9 = param._reader.segment._4_4_;
            uVar10 = param._reader.capTable._0_4_;
            uVar11 = param._reader.capTable._4_4_;
          }
          local_d8.segment = (SegmentReader *)CONCAT44(uVar9,uVar8);
          local_d8.capTable = (CapTableReader *)CONCAT44(uVar11,uVar10);
          local_b8 = (ArrayPtr<const_char>)
                     _::PointerReader::getBlob<capnp::Text>(&local_d8,(void *)0x0,0);
          kj::strTree<char_const(&)[31],capnp::Text::Reader,char_const(&)[6]>
                    ((StringTree *)&depMap,(kj *)"  ::capnp::_::brandBindingFor<",
                     (char (*) [31])&local_b8,(Reader *)">(),\n",(char (*) [6])params_2);
          if (bindings.builder.pos == bindings.builder.endPtr) {
            newSize = ((long)bindings.builder.pos - (long)bindings.builder.ptr >> 3) *
                      -0x2492492492492492;
            if (bindings.builder.pos == bindings.builder.ptr) {
              newSize = 4;
            }
            kj::Vector<kj::StringTree>::setCapacity(&bindings,newSize);
          }
          (bindings.builder.pos)->size_ = depMap._M_t._M_impl._0_8_;
          ((bindings.builder.pos)->text).content.ptr =
               (char *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          ((bindings.builder.pos)->text).content.size_ =
               (size_t)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          ((bindings.builder.pos)->text).content.disposer =
               (ArrayDisposer *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          ((bindings.builder.pos)->branches).ptr =
               (Branch *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          ((bindings.builder.pos)->branches).size_ =
               depMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
          ((bindings.builder.pos)->branches).disposer = (ArrayDisposer *)local_e0;
          bindings.builder.pos = bindings.builder.pos + 1;
          index = index + _S_black;
        } while (_Var1 != index);
      }
      depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      depMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      schema_00.raw = local_e0;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &scopeMap._M_t._M_impl.super__Rb_tree_header);
  }
  makeBrandDepMap(&depMap,local_a8,local_a0,schema_00);
  param._reader.capTable =
       (CapTableReader *)(((long)scopes.pos - (long)pRVar6 >> 3) * 0x6db6db6db6db6db7);
  param._reader.data = &kj::_::HeapArrayDisposer::instance;
  param._reader.segment = (SegmentReader *)pRVar6;
  kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
            (&__return_storage_ptr__->scopes,(kj *)0x221eb1,(char (*) [3])&param,
             (Array<kj::StringTree> *)"}",(char (*) [2])params_2);
  if (bindings.builder.pos != bindings.builder.endPtr) {
    kj::Vector<kj::StringTree>::setCapacity
              (&bindings,
               ((long)bindings.builder.pos - (long)bindings.builder.ptr >> 3) * 0x6db6db6db6db6db7);
  }
  local_d8.capTable =
       (CapTableReader *)
       (((long)bindings.builder.pos - (long)bindings.builder.ptr >> 3) * 0x6db6db6db6db6db7);
  local_d8.segment = (SegmentReader *)bindings.builder.ptr;
  local_d8.pointer = (WirePointer *)bindings.builder.disposer;
  bindings.builder.ptr = (StringTree *)0x0;
  bindings.builder.pos = (RemoveConst<kj::StringTree> *)0x0;
  bindings.builder.endPtr = (StringTree *)0x0;
  kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
            (&__return_storage_ptr__->bindings,(kj *)0x221eb1,(char (*) [3])&local_d8,
             (Array<kj::StringTree> *)"}",(char (*) [2])params_2);
  makeBrandDepInitializers(&__return_storage_ptr__->dependencies,(CapnpcCppMain *)&depMap,depMap_00)
  ;
  pCVar5 = local_d8.capTable;
  pSVar4 = local_d8.segment;
  __return_storage_ptr__->dependencyCount = depMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((StringTree *)local_d8.segment != (StringTree *)0x0) {
    local_d8.segment = (SegmentReader *)0x0;
    local_d8.capTable = (CapTableReader *)0x0;
    (**(_func_int **)*local_d8.pointer)
              (local_d8.pointer,pSVar4,0x38,pCVar5,pCVar5,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  pCVar5 = param._reader.capTable;
  pSVar4 = param._reader.segment;
  if (param._reader.segment != (SegmentReader *)0x0) {
    param._reader.segment = (SegmentReader *)0x0;
    param._reader.capTable = (CapTableReader *)0x0;
    (*(code *)**param._reader.data)
              (param._reader.data,pSVar4,0x38,pCVar5,pCVar5,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_kj::StringTree>,_std::_Select1st<std::pair<const_unsigned_int,_kj::StringTree>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  ::~_Rb_tree(&depMap._M_t);
  pSVar3 = bindings.builder.endPtr;
  pRVar6 = bindings.builder.pos;
  pSVar2 = bindings.builder.ptr;
  if (bindings.builder.ptr != (StringTree *)0x0) {
    bindings.builder.ptr = (StringTree *)0x0;
    bindings.builder.pos = (RemoveConst<kj::StringTree> *)0x0;
    bindings.builder.endPtr = (StringTree *)0x0;
    (**(bindings.builder.disposer)->_vptr_ArrayDisposer)
              (bindings.builder.disposer,pSVar2,0x38,
               ((long)pRVar6 - (long)pSVar2 >> 3) * 0x6db6db6db6db6db7,
               ((long)pSVar3 - (long)pSVar2 >> 3) * 0x6db6db6db6db6db7,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  ::~_Rb_tree(&scopeMap._M_t);
  return extraout_RAX;
}

Assistant:

BrandInitializerText makeBrandInitializers(
      const TemplateContext& templateContext, Schema schema) {
    auto scopeMap = templateContext.getScopeMap();

    auto scopes = kj::heapArrayBuilder<kj::StringTree>(scopeMap.size());
    kj::Vector<kj::StringTree> bindings(scopeMap.size() * 2);  // (estimate two params per scope)

    for (auto& scope: scopeMap) {
      scopes.add(kj::strTree("  { ",
        "0x", kj::hex(scope.first), ", "
        "brandBindings + ", bindings.size(), ", ",
        scope.second.size(), ", "
        "false"
      "},\n"));

      for (auto param: scope.second) {
        bindings.add(kj::strTree("  ::capnp::_::brandBindingFor<", param.getName(), ">(),\n"));
      }
    }

    auto depMap = makeBrandDepMap(templateContext, schema);
    auto dependencyCount = depMap.size();
    return {
      kj::strTree("{\n", scopes.finish(), "}"),
      kj::strTree("{\n", bindings.releaseAsArray(), "}"),
      makeBrandDepInitializers(kj::mv(depMap)),
      dependencyCount
    };
  }